

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicKey.cpp
# Opt level: O1

int jbcoin::verify(EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined7 extraout_var;
  undefined1 *puVar4;
  long lVar5;
  uint8_t S [32];
  result_type local_48;
  
  if (*(long *)ctx == 0x21) {
    if (ctx[8] == (EVP_PKEY_CTX)0xed) {
      bVar2 = true;
      bVar1 = false;
      goto LAB_001a8434;
    }
    bVar2 = true;
    bVar1 = true;
    if (((byte)ctx[8] & 0xfe) == 2) goto LAB_001a8434;
  }
  bVar1 = true;
  bVar2 = false;
LAB_001a8434:
  if (bVar2) {
    if (bVar1) {
      sha512Half<jbcoin::Slice>(&local_48,(Slice *)sig);
      bVar2 = verifyDigest((PublicKey *)ctx,&local_48,(Slice *)siglen,SUB81(tbs,0));
      return (int)CONCAT71(extraout_var,bVar2);
    }
    if (*(long *)(siglen + 8) == 0x40) {
      puVar4 = (undefined1 *)(*(long *)siglen + 0x3f);
      lVar5 = 0;
      do {
        *(undefined1 *)((long)local_48.pn + lVar5) = *puVar4;
        lVar5 = lVar5 + 1;
        puVar4 = puVar4 + -1;
      } while (lVar5 != 0x20);
      iVar3 = memcmp(&local_48,&DAT_0028cc00,0x20);
      if (iVar3 < 0) {
        iVar3 = ed25519_sign_open(*(uchar **)sig,*(size_t *)(sig + 8),(uchar *)(ctx + 9),
                                  *(uchar **)siglen);
        return CONCAT31((int3)((uint)iVar3 >> 8),iVar3 == 0);
      }
    }
  }
  return 0;
}

Assistant:

bool
verify (PublicKey const& publicKey,
    Slice const& m,
    Slice const& sig,
    bool mustBeFullyCanonical)
{
    if (auto const type = publicKeyType(publicKey))
    {
        if (*type == KeyType::secp256k1)
        {
            return verifyDigest (publicKey,
                sha512Half(m), sig, mustBeFullyCanonical);
        }
        else if (*type == KeyType::ed25519)
        {
            if (! ed25519Canonical(sig))
                return false;

            // We internally prefix Ed25519 keys with a 0xED
            // byte to distinguish them from secp256k1 keys
            // so when verifying the signature, we need to
            // first strip that prefix.
            return ed25519_sign_open(
                m.data(), m.size(), publicKey.data() + 1,
                    sig.data()) == 0;
        }
    }
    return false;
}